

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  cmInstallGenerator *this_00;
  __type _Var2;
  bool bVar3;
  char *pcVar4;
  reference s;
  ulong uVar5;
  reference pvVar6;
  string *psVar7;
  cmState *this_01;
  ostream *poVar8;
  void *pvVar9;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *this_02;
  reference ppcVar10;
  string *psVar11;
  PolicyID id;
  bool local_95d;
  byte local_819;
  cmStateDirectory local_7d8;
  undefined1 local_7b0 [8];
  string odir;
  string local_788;
  cmStateDirectory local_768;
  reference local_740;
  cmStateSnapshot *c_1;
  iterator __end3;
  iterator __begin3;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range3;
  undefined1 local_708 [8];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string local_6d0;
  undefined1 local_6b0 [8];
  ostringstream e;
  allocator<char> local_531;
  string local_530;
  cmInstallGenerator *local_510;
  cmInstallGenerator *installer_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range2_2;
  cmInstallGenerator *installer;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range2_1;
  bool haveInstallAfterSubdirectory;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *pvStack_4c8;
  bool haveSubdirectoryInstall;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *installers;
  PolicyStatus status;
  char *local_498;
  char *defaultDirPermissions;
  string local_488;
  char *local_468;
  char *crosscompiling;
  string local_458;
  char *local_438;
  char *so_no_exe;
  undefined1 local_408 [8];
  cmGeneratedFileStream fout;
  undefined1 local_1b8 [4];
  int toplevel_install;
  string homedir;
  undefined1 local_170 [8];
  string file;
  string *configurationType;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  char **c;
  char *default_order [5];
  string default_config;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_78;
  char *local_58;
  char *stagingPrefix;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *prefix;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  prefix = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_PREFIX",&local_39);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    local_18 = "/usr/local";
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_STAGING_PREFIX",
             (allocator<char> *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (pcVar4 != (char *)0x0) {
    local_18 = pcVar4;
  }
  local_58 = pcVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  cmMakefile::GetConfigurations
            ((string *)((long)&default_config.field_2 + 8),this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,false);
  psVar11 = (string *)(&default_config.field_2._M_allocated_capacity + 1);
  std::__cxx11::string::string((string *)(default_order + 4),(string *)psVar11);
  memcpy(&c,&DAT_00a23d30,0x28);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&c;
  while( true ) {
    local_819 = 0;
    if ((__range2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      local_819 = std::__cxx11::string::empty();
    }
    if ((local_819 & 1) == 0) break;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&config);
    configurationType =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&configurationType), bVar3) {
      s = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
      cmsys::SystemTools::UpperCase((string *)((long)&file.field_2 + 8),s);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&file.field_2 + 8),
                              (char *)(__range2->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      if (bVar3) {
        std::__cxx11::string::operator=((string *)(default_order + 4),(string *)s);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(__range2->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) &&
     (bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&config), !bVar3)) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&config,0);
    std::__cxx11::string::operator=((string *)(default_order + 4),(string *)pvVar6);
  }
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)((long)&homedir.field_2 + 8),&this->StateSnapshot);
  psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                     ((cmStateDirectory *)((long)&homedir.field_2 + 8));
  std::__cxx11::string::string((string *)local_170,(string *)psVar7);
  this_01 = GetState(this);
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_(this_01);
  std::__cxx11::string::string((string *)local_1b8,(string *)psVar7);
  fout._580_4_ = 0;
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_170,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b8);
  if (_Var2) {
    fout._580_4_ = 1;
  }
  std::__cxx11::string::operator+=((string *)local_170,"/cmake_install.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_408,(string *)local_170,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_408,true);
  poVar8 = std::operator<<((ostream *)local_408,"# Install script for directory: ");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&so_no_exe,&this->StateSnapshot);
  psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&so_no_exe);
  poVar8 = std::operator<<(poVar8,(string *)psVar7);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)local_408,"# Set the install prefix");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"  set(CMAKE_INSTALL_PREFIX \"");
  poVar8 = std::operator<<(poVar8,local_18);
  poVar8 = std::operator<<(poVar8,"\")");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"endif()");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  poVar8 = std::operator<<(poVar8,"\"${CMAKE_INSTALL_PREFIX}\")");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)local_408,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar8 = std::operator<<(poVar8,(string *)(default_order + 4));
  std::operator<<(poVar8,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)local_408,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"CMAKE_INSTALL_SO_NO_EXE",
             (allocator<char> *)((long)&crosscompiling + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)((long)&crosscompiling + 7));
  local_438 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)local_408,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    poVar8 = std::operator<<(poVar8,local_438);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"CMAKE_CROSSCOMPILING",
             (allocator<char> *)((long)&defaultDirPermissions + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)((long)&defaultDirPermissions + 7));
  local_468 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)local_408,
                             "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
                            );
    poVar8 = std::operator<<(poVar8,local_468);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
             (allocator<char> *)((long)&installers + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::allocator<char>::~allocator((allocator<char> *)((long)&installers + 7));
  local_498 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)local_408,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
                            );
    poVar8 = std::operator<<(poVar8,local_498);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  installers._0_4_ = GetPolicyStatus(this,CMP0082);
  this_02 = cmMakefile::GetInstallGenerators(this->Makefile);
  __range2_1._7_1_ = 0;
  __range2_1._6_1_ = 0;
  pvStack_4c8 = this_02;
  if ((PolicyStatus)installers == WARN) {
    __end2_1 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                         (this_02);
    installer = (cmInstallGenerator *)
                std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                          (this_02);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                               *)&installer), bVar3) {
      ppcVar10 = __gnu_cxx::
                 __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                 ::operator*(&__end2_1);
      this_00 = *ppcVar10;
      (*(this_00->super_cmScriptGenerator)._vptr_cmScriptGenerator[9])
                (this_00,(long)&__range2_1 + 7,(long)&__range2_1 + 6);
      cmScriptGenerator::Generate
                (&this_00->super_cmScriptGenerator,(ostream *)local_408,psVar11,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      __gnu_cxx::
      __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
      ::operator++(&__end2_1);
    }
  }
  else {
    __end2_2 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                         (this_02);
    installer_1 = (cmInstallGenerator *)
                  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                            (this_02);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                               *)&installer_1), bVar3) {
      ppcVar10 = __gnu_cxx::
                 __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                 ::operator*(&__end2_2);
      local_510 = *ppcVar10;
      cmScriptGenerator::Generate
                (&local_510->super_cmScriptGenerator,(ostream *)local_408,psVar11,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      __gnu_cxx::
      __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
      ::operator++(&__end2_2);
    }
  }
  GenerateTargetInstallRules
            (this,(ostream *)local_408,psVar11,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
  if ((PolicyStatus)installers != OLD) {
    if ((PolicyStatus)installers != WARN) goto LAB_0049ec92;
    local_95d = false;
    if ((__range2_1._6_1_ & 1) != 0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_530,"CMAKE_POLICY_WARNING_CMP0082",&local_531);
      local_95d = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator(&local_531);
    }
    if (local_95d != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_6d0,(cmPolicies *)0x52,id);
      poVar8 = std::operator<<((ostream *)local_6b0,(string *)&local_6d0);
      std::operator<<(poVar8,"\n");
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,
                   (string *)
                   &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
    }
  }
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&__range3,this->Makefile);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_708,
             (cmStateSnapshot *)&__range3);
  bVar3 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::empty
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_708);
  if (!bVar3) {
    std::operator<<((ostream *)local_408,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)local_408,"  # Include the install script for each subdirectory.\n");
    __end3 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin
                       ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_708);
    c_1 = (cmStateSnapshot *)
          std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_708);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                       *)&c_1), bVar3) {
      local_740 = __gnu_cxx::
                  __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                  ::operator*(&__end3);
      cmStateSnapshot::GetDirectory(&local_768,local_740);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_788,"EXCLUDE_FROM_ALL",
                 (allocator<char> *)(odir.field_2._M_local_buf + 0xf));
      bVar3 = cmStateDirectory::GetPropertyAsBool(&local_768,&local_788);
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator((allocator<char> *)(odir.field_2._M_local_buf + 0xf));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        cmStateSnapshot::GetDirectory(&local_7d8,local_740);
        psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_7d8);
        std::__cxx11::string::string((string *)local_7b0,(string *)psVar11);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_7b0);
        poVar8 = std::operator<<((ostream *)local_408,"  include(\"");
        poVar8 = std::operator<<(poVar8,(string *)local_7b0);
        poVar8 = std::operator<<(poVar8,"/cmake_install.cmake\")");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_7b0);
      }
      __gnu_cxx::
      __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
      ::operator++(&__end3);
    }
    std::operator<<((ostream *)local_408,"\n");
    std::operator<<((ostream *)local_408,"endif()\n\n");
  }
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_708);
LAB_0049ec92:
  if (fout._580_4_ != 0) {
    poVar8 = std::operator<<((ostream *)local_408,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)local_1b8);
    std::operator<<(poVar8,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_408);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)(default_order + 4));
  std::__cxx11::string::~string((string *)(default_config.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");

#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if (!prefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix_win32)) {
      prefix_win32 = "C:";
    }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (project_name && project_name[0]) {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
    } else {
      prefix_win32 += "/InstalledCMakeProject";
    }
    prefix = prefix_win32.c_str();
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!prefix) {
    prefix = "/usr/local";
  }
#endif
  if (const char* stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (const char* so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (const char* crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (const char* defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (cmInstallGenerator* installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (cmInstallGenerator* installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")"
                 << std::endl;
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}